

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
::AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
           *this,FieldDescriptor **key)

{
  BitMask<unsigned_short,_16,_0,_false> *pBVar1;
  bool bVar2;
  hasher *this_00;
  slot_type *slot;
  size_t sVar3;
  CommonFields *this_01;
  NonIterableBitMask<unsigned_long,_8,_3> NVar4;
  BitMask<unsigned_short,_16,_0,_false> *pBVar5;
  undefined1 local_d8 [8];
  anon_class_24_3_2b146c49 assert_consistent;
  size_t hash_of_arg;
  FieldDescriptor **key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
  *this_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
  *local_a0;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
  *local_98;
  uint local_90;
  NonIterableBitMask<unsigned_short,_16,_0> local_8c;
  NonIterableBitMask<unsigned_short,_16,_0> local_8a;
  uint32_t i_1;
  BitMask<unsigned_short,_16,_0,_false> __end4_1;
  BitMask<unsigned_short,_16,_0,_false> __begin4_1;
  NonIterableBitMask<unsigned_short,_16,_0> local_72;
  NonIterableBitMask<unsigned_short,_16,_0> *local_70;
  BitMask<unsigned_short,_16,_0,_false> *__range4_1;
  size_t original_size_for_assert;
  size_t remaining;
  NonIterableBitMask<unsigned_long,_8,_3> NStack_50;
  uint32_t i;
  BitMask<unsigned_long,_8,_3,_false> __end4;
  BitMask<unsigned_long,_8,_3,_false> __begin4;
  BitMask<unsigned_long,_8,_3,_false> *__range4;
  NonIterableBitMask<unsigned_long,_8,_3> local_30;
  BitMask<unsigned_long,_8,_3,_false> mask;
  ctrl_t *ctrl;
  size_t cap;
  
  bVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                   *)this);
  if (!bVar2) {
    this_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
              ::hash_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                          *)this);
    assert_consistent.hash_of_arg =
         (size_t *)
         HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash::operator()
                   ((Hash *)this_00,key);
    assert_consistent.this =
         (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
          *)&assert_consistent.hash_of_arg;
    local_d8 = (undefined1  [8])key;
    assert_consistent.key = (FieldDescriptor **)this;
    bVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
            ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                      *)this);
    if (bVar2) {
      slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                         *)this);
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
      ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::anon_class_24_3_2b146c49
      ::operator()((anon_class_24_3_2b146c49 *)local_d8,(ctrl_t *)0x0,slot);
    }
    else {
      sVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
              ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                          *)this);
      if (sVar3 < 0x11) {
        this_01 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                  ::common((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                            *)this);
        cap = (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                      ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                                    *)this);
        this_local = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                      *)local_d8;
        local_a0 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                    *)assert_consistent.key;
        local_98 = assert_consistent.this;
        sVar3 = CommonFields::capacity(this_01);
        mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
             (NonIterableBitMask<unsigned_long,_8,_3>)CommonFields::control(this_01);
        bVar2 = is_small(sVar3);
        if (bVar2) {
          if (8 < sVar3) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          GroupPortableImpl::GroupPortableImpl
                    ((GroupPortableImpl *)&__range4,
                     (ctrl_t *)
                     ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + sVar3));
          local_30.mask_ =
               (unsigned_long)GroupPortableImpl::MaskFull((GroupPortableImpl *)&__range4);
          mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
               (NonIterableBitMask<unsigned_long,_8,_3>)
               ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ - 1);
          __end4 = BitMask<unsigned_long,_8,_3,_false>::begin
                             ((BitMask<unsigned_long,_8,_3,_false> *)&local_30);
          NStack_50.mask_ =
               (unsigned_long)
               BitMask<unsigned_long,_8,_3,_false>::end
                         ((BitMask<unsigned_long,_8,_3,_false> *)&local_30);
          while (bVar2 = container_internal::operator!=
                                   (&__end4,(BitMask<unsigned_long,_8,_3,_false> *)
                                            &stack0xffffffffffffffb0), bVar2) {
            remaining._4_4_ = BitMask<unsigned_long,_8,_3,_false>::operator*(&__end4);
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
            ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::
            anon_class_24_3_2b146c49::operator()
                      ((anon_class_24_3_2b146c49 *)&this_local,
                       (ctrl_t *)
                       ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                       (ulong)remaining._4_4_),
                       (slot_type *)(cap + ((ulong)remaining._4_4_ - 1) * 0x20));
            BitMask<unsigned_long,_8,_3,_false>::operator++(&__end4);
          }
        }
        else {
          __range4_1 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(this_01);
          original_size_for_assert = (size_t)__range4_1;
          while (pBVar1 = __range4_1, original_size_for_assert != 0) {
            GroupSse2Impl::GroupSse2Impl
                      ((GroupSse2Impl *)&i_1,
                       (ctrl_t *)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_);
            local_72.mask_ = (unsigned_short)GroupSse2Impl::MaskFull((GroupSse2Impl *)&i_1);
            local_70 = &local_72;
            local_8a.mask_ =
                 (unsigned_short)
                 BitMask<unsigned_short,_16,_0,_false>::begin
                           ((BitMask<unsigned_short,_16,_0,_false> *)local_70);
            local_8c.mask_ =
                 (unsigned_short)
                 BitMask<unsigned_short,_16,_0,_false>::end
                           ((BitMask<unsigned_short,_16,_0,_false> *)local_70);
            while (bVar2 = container_internal::operator!=
                                     ((BitMask<unsigned_short,_16,_0,_false> *)&local_8a,
                                      (BitMask<unsigned_short,_16,_0,_false> *)&local_8c), bVar2) {
              local_90 = BitMask<unsigned_short,_16,_0,_false>::operator*
                                   ((BitMask<unsigned_short,_16,_0,_false> *)&local_8a);
              bVar2 = IsFull(*(ctrl_t *)
                              ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                              (ulong)local_90));
              if (!bVar2) {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
              ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::
              anon_class_24_3_2b146c49::operator()
                        ((anon_class_24_3_2b146c49 *)&this_local,
                         (ctrl_t *)
                         ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                         (ulong)local_90),(slot_type *)(cap + (ulong)local_90 * 0x20));
              original_size_for_assert = original_size_for_assert - 1;
              BitMask<unsigned_short,_16,_0,_false>::operator++
                        ((BitMask<unsigned_short,_16,_0,_false> *)&local_8a);
            }
            NVar4 = mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0x10;
            cap = cap + 0x200;
            if ((original_size_for_assert == 0) ||
               (bVar2 = false,
               *(char *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0xf) != -1
               )) {
              bVar2 = true;
            }
            mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
                 (NonIterableBitMask<unsigned_long,_8,_3>)
                 (NonIterableBitMask<unsigned_long,_8,_3>)NVar4.mask_;
            if (!bVar2) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
          pBVar5 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(this_01);
          if (pBVar1 < pBVar5) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }